

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O3

void writeSolutionFile(FILE *file,HighsOptions *options,HighsModel *model,HighsBasis *basis,
                      HighsSolution *solution,HighsInfo *info,HighsModelStatus model_status,
                      HighsInt style)

{
  HighsLogOptions *log_options;
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool have_dual;
  pointer pHVar3;
  HighsVarType *integrality;
  array<char,_32UL> objStr;
  string local_208;
  HighsInfo *local_1e8;
  vector<double,_std::allocator<double>_> *local_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  stringstream ss;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  log_options = &(options->super_HighsOptionsStruct).log_options;
  local_1e8 = info;
  if (style == 1) {
    local_1c8 = (ulong)basis->valid;
    have_dual = solution->dual_valid;
    local_1d0 = (ulong)have_dual;
    pHVar3 = (model->lp_).integrality_.
             super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
             super__Vector_impl_data._M_start;
    integrality = (HighsVarType *)0x0;
    if ((model->lp_).integrality_.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
        _M_impl.super__Vector_impl_data._M_finish != pHVar3) {
      integrality = pHVar3;
    }
    local_1c0 = (ulong)solution->value_valid;
    local_1d8 = &(model->lp_).col_names_;
    local_1e0 = &solution->col_value;
    writeModelBoundSolution
              (file,log_options,true,(model->lp_).num_col_,&(model->lp_).col_lower_,
               &(model->lp_).col_upper_,local_1d8,solution->value_valid,local_1e0,have_dual,
               &solution->col_dual,basis->valid,&basis->col_status,integrality);
    writeModelBoundSolution
              (file,log_options,false,(model->lp_).num_row_,&(model->lp_).row_lower_,
               &(model->lp_).row_upper_,&(model->lp_).row_names_,SUB81(local_1c0,0),
               &solution->row_value,have_dual,&solution->row_dual,SUB81(local_1c8,0),
               &basis->row_status,(HighsVarType *)0x0);
    _ss = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"\n","");
    highsFprintfString(file,log_options,(string *)&ss);
    if (_ss != local_1a8) {
      operator_delete(_ss);
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    pcVar1 = objStr._M_elems + 0x10;
    objStr._M_elems[8] = '\0';
    objStr._M_elems[9] = '\0';
    objStr._M_elems[10] = '\0';
    objStr._M_elems[0xb] = '\0';
    objStr._M_elems[0xc] = '\0';
    objStr._M_elems[0xd] = '\0';
    objStr._M_elems[0xe] = '\0';
    objStr._M_elems[0xf] = '\0';
    objStr._M_elems[0x10] = '\0';
    objStr._M_elems._0_8_ = pcVar1;
    std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
    if ((char *)objStr._M_elems._0_8_ != pcVar1) {
      operator_delete((void *)objStr._M_elems._0_8_);
    }
    utilModelStatusToString_abi_cxx11_(&local_208,model_status);
    highsFormatToString_abi_cxx11_
              ((string *)&objStr,"Model status: %s\n",local_208._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(char *)objStr._M_elems._0_8_,objStr._M_elems._8_8_);
    if ((char *)objStr._M_elems._0_8_ != pcVar1) {
      operator_delete((void *)objStr._M_elems._0_8_);
    }
    paVar2 = &local_208.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar2) {
      operator_delete(local_208._M_dataplus._M_p);
    }
    std::__cxx11::stringbuf::str();
    highsFprintfString(file,log_options,(string *)&objStr);
    if ((char *)objStr._M_elems._0_8_ != pcVar1) {
      operator_delete((void *)objStr._M_elems._0_8_);
    }
    highsDoubleToString(&objStr,(local_1e8->super_HighsInfoStruct).objective_function_value,1e-13);
    local_208._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"\n","");
    highsFprintfString(file,log_options,&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar2) {
      operator_delete(local_208._M_dataplus._M_p);
    }
    local_208._M_string_length = 0;
    local_208.field_2._M_local_buf[0] = '\0';
    local_208._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar2) {
      operator_delete(local_208._M_dataplus._M_p);
    }
    highsFormatToString_abi_cxx11_(&local_208,"Objective value: %s\n",&objStr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar2) {
      operator_delete(local_208._M_dataplus._M_p);
    }
    std::__cxx11::stringbuf::str();
    highsFprintfString(file,log_options,&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar2) {
      operator_delete(local_208._M_dataplus._M_p);
    }
  }
  else {
    if (style == -1) {
      writeOldRawSolution(file,log_options,&model->lp_,basis,solution);
      return;
    }
    if ((style & 0xfffffffeU) == 2) {
      writeGlpsolSolution(file,options,model,basis,solution,model_status,info,style == 2);
      return;
    }
    _ss = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"Model status\n","");
    highsFprintfString(file,log_options,(string *)&ss);
    if (_ss != local_1a8) {
      operator_delete(_ss);
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    pcVar1 = objStr._M_elems + 0x10;
    objStr._M_elems[8] = '\0';
    objStr._M_elems[9] = '\0';
    objStr._M_elems[10] = '\0';
    objStr._M_elems[0xb] = '\0';
    objStr._M_elems[0xc] = '\0';
    objStr._M_elems[0xd] = '\0';
    objStr._M_elems[0xe] = '\0';
    objStr._M_elems[0xf] = '\0';
    objStr._M_elems[0x10] = '\0';
    objStr._M_elems._0_8_ = pcVar1;
    std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
    if ((char *)objStr._M_elems._0_8_ != pcVar1) {
      operator_delete((void *)objStr._M_elems._0_8_);
    }
    utilModelStatusToString_abi_cxx11_(&local_208,model_status);
    highsFormatToString_abi_cxx11_((string *)&objStr,"%s\n",local_208._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(char *)objStr._M_elems._0_8_,objStr._M_elems._8_8_);
    if ((char *)objStr._M_elems._0_8_ != pcVar1) {
      operator_delete((void *)objStr._M_elems._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p);
    }
    std::__cxx11::stringbuf::str();
    highsFprintfString(file,log_options,(string *)&objStr);
    if ((char *)objStr._M_elems._0_8_ != pcVar1) {
      operator_delete((void *)objStr._M_elems._0_8_);
    }
    writeModelSolution(file,log_options,model,solution,local_1e8,style == 4);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void writeSolutionFile(FILE* file, const HighsOptions& options,
                       const HighsModel& model, const HighsBasis& basis,
                       const HighsSolution& solution, const HighsInfo& info,
                       const HighsModelStatus model_status,
                       const HighsInt style) {
  const bool have_primal = solution.value_valid;
  const bool have_dual = solution.dual_valid;
  const bool have_basis = basis.valid;
  const HighsLp& lp = model.lp_;
  const HighsLogOptions& log_options = options.log_options;
  if (style == kSolutionStyleOldRaw) {
    writeOldRawSolution(file, log_options, lp, basis, solution);
  } else if (style == kSolutionStylePretty) {
    const HighsVarType* integrality =
        lp.integrality_.size() > 0 ? lp.integrality_.data() : nullptr;
    writeModelBoundSolution(file, log_options, true, lp.num_col_, lp.col_lower_,
                            lp.col_upper_, lp.col_names_, have_primal,
                            solution.col_value, have_dual, solution.col_dual,
                            have_basis, basis.col_status, integrality);
    writeModelBoundSolution(file, log_options, false, lp.num_row_,
                            lp.row_lower_, lp.row_upper_, lp.row_names_,
                            have_primal, solution.row_value, have_dual,
                            solution.row_dual, have_basis, basis.row_status);
    highsFprintfString(file, log_options, "\n");
    std::stringstream ss;
    ss.str(std::string());
    ss << highsFormatToString("Model status: %s\n",
                              utilModelStatusToString(model_status).c_str());
    highsFprintfString(file, log_options, ss.str());
    auto objStr = highsDoubleToString((double)info.objective_function_value,
                                      kHighsSolutionValueToStringTolerance);
    highsFprintfString(file, log_options, "\n");
    ss.str(std::string());
    ss << highsFormatToString("Objective value: %s\n", objStr.data());
    highsFprintfString(file, log_options, ss.str());
  } else if (style == kSolutionStyleGlpsolRaw ||
             style == kSolutionStyleGlpsolPretty) {
    const bool raw = style == kSolutionStyleGlpsolRaw;
    writeGlpsolSolution(file, options, model, basis, solution, model_status,
                        info, raw);
  } else {
    // Standard raw solution file, possibly sparse => only nonzero primal values
    const bool sparse = style == kSolutionStyleSparse;
    assert(style == kSolutionStyleRaw || sparse);
    highsFprintfString(file, log_options, "Model status\n");
    std::stringstream ss;
    ss.str(std::string());
    ss << highsFormatToString("%s\n",
                              utilModelStatusToString(model_status).c_str());
    highsFprintfString(file, log_options, ss.str());
    writeModelSolution(file, log_options, model, solution, info, sparse);
  }
}